

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

int __thiscall cmGraphVizWriter::CollectAllTargets(cmGraphVizWriter *this)

{
  cmGeneratorTarget *pcVar1;
  int iVar2;
  bool bVar3;
  reference ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar5;
  char *pcVar6;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar7;
  allocator local_279;
  key_type local_278;
  allocator local_251;
  key_type local_250;
  string local_230 [32];
  undefined1 local_210 [8];
  ostringstream ostr;
  allocator local_91;
  string local_90;
  char *local_60;
  char *realTargetName;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_50;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_48;
  const_iterator it;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_20;
  const_iterator lit;
  int cnt;
  cmGraphVizWriter *this_local;
  
  lit._M_current._4_4_ = 0;
  local_20._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                 (this->LocalGenerators);
  while( true ) {
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                            (this->LocalGenerators);
    bVar3 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&targets.
                           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_20);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar4);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it,__x);
    local_50._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
    ::__normal_iterator<cmGeneratorTarget**>
              ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                *)&local_48,&local_50);
    while( true ) {
      realTargetName =
           (char *)std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                             ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)
                              &it);
      bVar3 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)&realTargetName);
      if (!bVar3) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_48);
      cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar5);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_60 = pcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,pcVar6,&local_91);
      bVar3 = IgnoreThisTarget(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
        this_00 = std::operator<<((ostream *)local_210,(string *)&this->GraphNodePrefix);
        iVar2 = lit._M_current._4_4_;
        lit._M_current._4_4_ = lit._M_current._4_4_ + 1;
        std::ostream::operator<<(this_00,iVar2);
        std::__cxx11::ostringstream::str();
        pcVar6 = local_60;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_250,pcVar6,&local_251);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this->TargetNamesNodes,&local_250);
        std::__cxx11::string::operator=((string *)this_01,local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        std::__cxx11::string::~string(local_230);
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_48);
        pcVar6 = local_60;
        pcVar1 = *ppcVar5;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_278,pcVar6,&local_279);
        ppcVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  ::operator[](&this->TargetPtrs,&local_278);
        *ppcVar7 = pcVar1;
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_48);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_20);
  }
  return lit._M_current._4_4_;
}

Assistant:

int cmGraphVizWriter::CollectAllTargets()
{
  int cnt = 0;
  // First pass get the list of all cmake targets
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
         this->LocalGenerators.begin();
       lit != this->LocalGenerators.end(); ++lit) {
    std::vector<cmGeneratorTarget*> targets = (*lit)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator it = targets.begin();
         it != targets.end(); ++it) {
      const char* realTargetName = (*it)->GetName().c_str();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      // std::cout << "Found target: " << tit->first << std::endl;
      std::ostringstream ostr;
      ostr << this->GraphNodePrefix << cnt++;
      this->TargetNamesNodes[realTargetName] = ostr.str();
      this->TargetPtrs[realTargetName] = *it;
    }
  }

  return cnt;
}